

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O3

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct,time_t timeT)

{
  uint uVar1;
  size_t sVar2;
  time_t __time0;
  cmTimestamp *this_00;
  string formatString;
  char buffer [16];
  tm tmUnixEpoch;
  _Alloc_hider local_208;
  size_type local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  undefined8 uStack_1f0;
  ostringstream local_1e8 [112];
  ios_base local_178 [272];
  tm local_68;
  
  this_00 = (cmTimestamp *)&local_208;
  local_208._M_p = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"%","");
  std::__cxx11::string::push_back((char)&local_208);
  uVar1 = (int)flag - 0x41;
  if (uVar1 < 0x39) {
    if ((0x140120b01141183U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((ulong)uVar1 == 0x32) {
        local_68.tm_sec = 0;
        local_68.tm_min = 0;
        local_68.tm_wday = 0;
        local_68.tm_yday = 0;
        local_68.tm_isdst = 0;
        local_68._36_4_ = 0;
        local_68.tm_gmtoff = 0;
        local_68.tm_zone = (char *)0x0;
        local_68.tm_hour = 0;
        local_68.tm_mday = 1;
        local_68.tm_mon = 0;
        local_68.tm_year = 0x46;
        __time0 = CreateUtcTimeTFromTm(this_00,&local_68);
        if (__time0 == -1) {
          cmSystemTools::Error
                    ("Error generating UNIX epoch in STRING(TIMESTAMP ...). Please, file a bug report against CMake"
                     ,(char *)0x0,(char *)0x0,(char *)0x0);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_1e8);
          difftime(timeT,__time0);
          std::ostream::_M_insert<long>((long)local_1e8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream(local_1e8);
          std::ios_base::~ios_base(local_178);
        }
        goto LAB_0028f295;
      }
      goto LAB_0028f360;
    }
  }
  else {
LAB_0028f360:
    if (flag != 0x25) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_208._M_p == &local_1f8) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f7,local_1f8);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1f0;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_208._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1f7,local_1f8);
      }
      __return_storage_ptr__->_M_string_length = local_200;
      local_200 = 0;
      local_1f8 = '\0';
      local_208._M_p = &local_1f8;
      goto LAB_0028f295;
    }
  }
  sVar2 = strftime((char *)local_1e8,0x10,local_208._M_p,(tm *)timeStruct);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1e8,local_1e8 + sVar2);
LAB_0028f295:
  if (local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(char flag,
                                               struct tm& timeStruct,
                                               const time_t timeT) const
{
  std::string formatString = "%";
  formatString += flag;

  switch (flag) {
    case 'a':
    case 'A':
    case 'b':
    case 'B':
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'w':
    case 'y':
    case 'Y':
    case '%':
      break;
    case 's': // Seconds since UNIX epoch (midnight 1-jan-1970)
    {
      // Build a time_t for UNIX epoch and substract from the input "timeT":
      struct tm tmUnixEpoch;
      memset(&tmUnixEpoch, 0, sizeof(tmUnixEpoch));
      tmUnixEpoch.tm_mday = 1;
      tmUnixEpoch.tm_year = 1970 - 1900;

      const time_t unixEpoch = this->CreateUtcTimeTFromTm(tmUnixEpoch);
      if (unixEpoch == -1) {
        cmSystemTools::Error(
          "Error generating UNIX epoch in "
          "STRING(TIMESTAMP ...). Please, file a bug report against CMake");
        return std::string();
      }

      std::ostringstream ss;
      ss << static_cast<long int>(difftime(timeT, unixEpoch));
      return ss.str();
    }
    default: {
      return formatString;
    }
  }

  char buffer[16];

  size_t size =
    strftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}